

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O2

int uv_udp_init_ex(uv_loop_t *loop,uv_udp_t *handle,uint flags)

{
  byte *pbVar1;
  int iVar2;
  
  iVar2 = -0x16;
  if ((flags < 0x200) && ((flags & 0xf7) == 2 || (flags & 0xff) == 0)) {
    iVar2 = uv__udp_init_ex(loop,handle,flags,flags & 0xff);
    if (0xff < flags && iVar2 == 0) {
      pbVar1 = (byte *)((long)&handle->flags + 3);
      *pbVar1 = *pbVar1 | 4;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int uv_udp_init_ex(uv_loop_t* loop, uv_udp_t* handle, unsigned flags) {
  unsigned extra_flags;
  int domain;
  int rc;

  /* Use the lower 8 bits for the domain. */
  domain = flags & 0xFF;
  if (domain != AF_INET && domain != AF_INET6 && domain != AF_UNSPEC)
    return UV_EINVAL;

  /* Use the higher bits for extra flags. */
  extra_flags = flags & ~0xFF;
  if (extra_flags & ~UV_UDP_RECVMMSG)
    return UV_EINVAL;

  rc = uv__udp_init_ex(loop, handle, flags, domain);

  if (rc == 0)
    if (extra_flags & UV_UDP_RECVMMSG)
      handle->flags |= UV_HANDLE_UDP_RECVMMSG;

  return rc;
}